

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_32x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffefa8;
  TX_SIZE in_stack_ffffffffffffefb6;
  TX_TYPE in_stack_ffffffffffffefb7;
  int32_t *in_stack_ffffffffffffefe0;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffefe8;
  int in_stack_ffffffffffffeff4;
  int32_t *in_stack_ffffffffffffeff8;
  int16_t *in_stack_fffffffffffff000;
  
  av1_get_fwd_txfm_cfg
            (in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb6,in_stack_ffffffffffffefa8);
  fwd_txfm2d_sse4_1(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff4,
                    in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[1024]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X32, &cfg);
  (void)bd;
  fwd_txfm2d_sse4_1(input, output, stride, &cfg, txfm_buf);
}